

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O2

walk_result __thiscall
jsoncons::jsonschema::
ref_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::do_walk(ref_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *this,eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                *context,
         basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *instance,
         json_pointer *instance_location,walk_reporter_type *reporter)

{
  long *plVar1;
  walk_result wVar2;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  this_context;
  eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  local_60;
  
  if (*(long *)&(this->
                super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                ).field_0xe0 == 0) {
    wVar2 = advance;
  }
  else {
    eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::eval_context(&local_60,context,
                   &(this->
                    super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    ).
                    super_keyword_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    .keyword_name_);
    plVar1 = *(long **)&(this->
                        super_keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                        ).field_0xe0;
    wVar2 = (**(code **)(*plVar1 + 0x30))(plVar1,&local_60,instance,instance_location,reporter);
    eval_context<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::~eval_context(&local_60);
  }
  return wVar2;
}

Assistant:

walk_result do_walk(const eval_context<Json>& context, const Json& instance, 
            const jsonpointer::json_pointer& instance_location, const walk_reporter_type& reporter) const final 
        {
            if (!referred_schema_)
            {
                return walk_result::advance;
            }
            eval_context<Json> this_context(context, this->keyword_name());
            return referred_schema_->walk(this_context, instance, instance_location, reporter);           
        }